

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad>::~TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *this)

{
  ~TPZMultiphysicsCompEl(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::~TPZMultiphysicsCompEl(){
    int nc = NConnects();
    for (int ic=0; ic<nc; ic++) {
        Connect(ic).RemoveDepend();
    }
}